

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

void vkt::Draw::MemoryOp::unpack
               (int pixelSize,int width,int height,int depth,VkDeviceSize rowPitchOrZero,
               VkDeviceSize depthPitchOrZero,void *srcBuffer,void *destBuffer)

{
  int local_7c;
  int r;
  VkDeviceSize offsetDepthSrc;
  VkDeviceSize offsetDepthDst;
  size_t d;
  deUint8 *dstStart;
  deUint8 *dstRow;
  deUint8 *srcStart;
  deUint8 *srcRow;
  VkDeviceSize size;
  VkDeviceSize depthPitch;
  VkDeviceSize rowPitch;
  VkDeviceSize depthPitchOrZero_local;
  VkDeviceSize rowPitchOrZero_local;
  int depth_local;
  int height_local;
  int width_local;
  int pixelSize_local;
  
  depthPitch = rowPitchOrZero;
  if (rowPitchOrZero == 0) {
    depthPitch = (VkDeviceSize)(width * pixelSize);
  }
  size = depthPitchOrZero;
  if (depthPitchOrZero == 0) {
    size = depthPitch * (long)height;
  }
  if ((depthPitch == (long)(width * pixelSize)) && (size == depthPitch * (long)height)) {
    ::deMemcpy(destBuffer,srcBuffer,size * (long)depth);
  }
  else {
    for (offsetDepthDst = 0; offsetDepthDst < (ulong)(long)depth;
        offsetDepthDst = offsetDepthDst + 1) {
      srcStart = (deUint8 *)((long)srcBuffer + offsetDepthDst * size);
      dstStart = (deUint8 *)((long)destBuffer + offsetDepthDst * (long)(pixelSize * width * height))
      ;
      for (local_7c = 0; local_7c < height; local_7c = local_7c + 1) {
        ::deMemcpy(dstStart,srcStart,(long)(pixelSize * width));
        srcStart = srcStart + depthPitch;
        dstStart = dstStart + pixelSize * width;
      }
    }
  }
  return;
}

Assistant:

void MemoryOp::unpack (int					pixelSize,
					   int					width,
					   int					height,
					   int					depth,
					   vk::VkDeviceSize		rowPitchOrZero,
					   vk::VkDeviceSize		depthPitchOrZero,
					   const void *			srcBuffer,
					   void *				destBuffer)
{
	vk::VkDeviceSize rowPitch	= rowPitchOrZero;
	vk::VkDeviceSize depthPitch = depthPitchOrZero;

	if (rowPitch == 0)
		rowPitch = width * pixelSize;

	if (depthPitch == 0)
		depthPitch = rowPitch * height;

	const vk::VkDeviceSize size = depthPitch * depth;

	const deUint8 *srcRow = reinterpret_cast<const deUint8 *>(srcBuffer);
	const deUint8 *srcStart;
	srcStart = srcRow;
	deUint8 *dstRow = reinterpret_cast<deUint8 *>(destBuffer);
	deUint8 *dstStart;
	dstStart = dstRow;

	if (rowPitch == static_cast<vk::VkDeviceSize>(width * pixelSize) &&
		depthPitch == static_cast<vk::VkDeviceSize>(rowPitch * height))
	{
		// fast path
		deMemcpy(dstRow, srcRow, static_cast<size_t>(size));
	}
	else {
		// slower, per row path
		for (size_t d = 0; d < (size_t)depth; d++)
		{
			vk::VkDeviceSize offsetDepthDst = d * (pixelSize * width * height);
			vk::VkDeviceSize offsetDepthSrc = d * depthPitch;
			srcRow = srcStart + offsetDepthSrc;
			dstRow = dstStart + offsetDepthDst;
			for (int r = 0; r < height; ++r)
			{
				deMemcpy(dstRow, srcRow, static_cast<size_t>(pixelSize * width));
				srcRow += rowPitch;
				dstRow += pixelSize * width;
			}
		}
	}
}